

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O0

void hbtrie_init_and_load
               (hbtrie *trie,int chunksize,int valuelen,int btree_nodesize,bid_t root_bid,
               void *btreeblk_handle,btree_blk_ops *btree_blk_ops,void *doc_handle,
               hbtrie_func_readkey *readkey,uint64_t num_keys,
               hbtrie_load_get_next_entry *get_next_entry,
               hbtrie_load_get_kv_from_entry *get_kv_from_entry,
               hbtrie_load_btreeblk_end *do_btreeblk_end,void *aux)

{
  char *expression;
  char *file;
  btree_kv_ops *pbVar1;
  btree_kv_ops *pbVar2;
  void *pvVar3;
  bid_t bVar4;
  uint32_t in_ECX;
  int in_EDX;
  uint in_ESI;
  hbtrie *in_RDI;
  bid_t in_R8;
  void *in_R9;
  btree_blk_ops *in_stack_00000008;
  void *in_stack_00000010;
  void *cur_entry;
  btree_kv_ops *btree_leaf_kv_ops;
  btree_kv_ops *btree_kv_ops;
  undefined4 in_stack_00000040;
  btree_kv_ops *in_stack_ffffffffffffffb0;
  uint64_t in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int line;
  
  line = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  in_RDI->chunksize = (uint8_t)in_ESI;
  in_RDI->valuelen = (uint8_t)in_EDX;
  in_RDI->btree_nodesize = in_ECX;
  in_RDI->btree_blk_ops = in_stack_00000008;
  in_RDI->btreeblk_handle = in_R9;
  in_RDI->doc_handle = in_stack_00000010;
  in_RDI->root_bid = in_R8;
  in_RDI->flag = '\0';
  in_RDI->leaf_height_limit = '\0';
  (in_RDI->cmp_args).chunksize = (uint8_t)in_ESI;
  (in_RDI->cmp_args).cmp_func = (undefined1 *)0x0;
  (in_RDI->cmp_args).user_param = (void *)0x0;
  in_RDI->aux = &in_RDI->cmp_args;
  expression = (char *)malloc(0x78);
  file = (char *)malloc(0x78);
  if (in_EDX != 8) {
    fdb_assert_die(expression,file,line,in_stack_ffffffffffffffb8,
                   (uint64_t)in_stack_ffffffffffffffb0);
  }
  if (in_ESI < 8) {
    fdb_assert_die(expression,file,line,in_stack_ffffffffffffffb8,
                   (uint64_t)in_stack_ffffffffffffffb0);
  }
  if ((in_ESI == 8) && (in_EDX == 8)) {
    pbVar1 = btree_kv_get_kb64_vb64(in_stack_ffffffffffffffb0);
    pbVar2 = btree_fast_str_kv_get_kb64_vb64(in_stack_ffffffffffffffb0);
  }
  else if ((in_ESI == 4) && (in_EDX == 8)) {
    pbVar1 = btree_kv_get_kb32_vb64(in_stack_ffffffffffffffb0);
    pbVar2 = btree_fast_str_kv_get_kb64_vb64(in_stack_ffffffffffffffb0);
  }
  else {
    pbVar1 = btree_kv_get_kbn_vb64(in_stack_ffffffffffffffb0);
    pbVar2 = btree_fast_str_kv_get_kb64_vb64(in_stack_ffffffffffffffb0);
  }
  in_RDI->btree_kv_ops = pbVar1;
  in_RDI->btree_leaf_kv_ops = pbVar2;
  in_RDI->readkey = (hbtrie_func_readkey *)cur_entry;
  in_RDI->map = (hbtrie_cmp_map *)0x0;
  pvVar3 = malloc((long)(int)in_ESI);
  in_RDI->last_map_chunk = pvVar3;
  memset(in_RDI->last_map_chunk,0xff,(long)(int)in_ESI);
  if (btree_leaf_kv_ops != (btree_kv_ops *)0x0) {
    pvVar3 = (void *)(*(code *)btree_kv_ops)(0,CONCAT44(btree_nodesize,in_stack_00000040));
    bVar4 = _hbtrie_load_recursive
                      (in_RDI,0,0,(uint64_t)btree_leaf_kv_ops,
                       (hbtrie_load_get_next_entry *)btree_kv_ops,
                       (hbtrie_load_get_kv_from_entry *)btreeblk_handle,
                       (hbtrie_load_btreeblk_end *)root_bid,pvVar3,
                       (void *)CONCAT44(btree_nodesize,in_stack_00000040));
    in_RDI->root_bid = bVar4;
  }
  return;
}

Assistant:

void hbtrie_init_and_load(struct hbtrie *trie, int chunksize, int valuelen,
                          int btree_nodesize, bid_t root_bid, void *btreeblk_handle,
                          struct btree_blk_ops *btree_blk_ops, void *doc_handle,
                          hbtrie_func_readkey *readkey,
                          uint64_t num_keys,
                          hbtrie_load_get_next_entry* get_next_entry,
                          hbtrie_load_get_kv_from_entry* get_kv_from_entry,
                          hbtrie_load_btreeblk_end* do_btreeblk_end,
                          void* aux)
{
    struct btree_kv_ops *btree_kv_ops, *btree_leaf_kv_ops;

    trie->chunksize = chunksize;
    trie->valuelen = valuelen;
    trie->btree_nodesize = btree_nodesize;
    trie->btree_blk_ops = btree_blk_ops;
    trie->btreeblk_handle = btreeblk_handle;
    trie->doc_handle = doc_handle;
    trie->root_bid = root_bid;
    trie->flag = 0x0;
    trie->leaf_height_limit = 0;
    trie->cmp_args.chunksize = chunksize;
    trie->cmp_args.cmp_func = NULL;
    trie->cmp_args.user_param = NULL;
    trie->aux = &trie->cmp_args;

    // assign key-value operations
    btree_kv_ops = (struct btree_kv_ops *)malloc(sizeof(struct btree_kv_ops));
    btree_leaf_kv_ops = (struct btree_kv_ops *)malloc(sizeof(struct btree_kv_ops));

    fdb_assert(valuelen == 8, valuelen, trie);
    fdb_assert((size_t)chunksize >= sizeof(void *), chunksize, trie);

    if (chunksize == 8 && valuelen == 8){
        btree_kv_ops = btree_kv_get_kb64_vb64(btree_kv_ops);
        btree_leaf_kv_ops = _get_leaf_kv_ops(btree_leaf_kv_ops);
    } else if (chunksize == 4 && valuelen == 8) {
        btree_kv_ops = btree_kv_get_kb32_vb64(btree_kv_ops);
        btree_leaf_kv_ops = _get_leaf_kv_ops(btree_leaf_kv_ops);
    } else {
        btree_kv_ops = btree_kv_get_kbn_vb64(btree_kv_ops);
        btree_leaf_kv_ops = _get_leaf_kv_ops(btree_leaf_kv_ops);
    }

    trie->btree_kv_ops = btree_kv_ops;
    trie->btree_leaf_kv_ops = btree_leaf_kv_ops;
    trie->readkey = readkey;
    trie->map = NULL;
    trie->last_map_chunk = (void *)malloc(chunksize);
    memset(trie->last_map_chunk, 0xff, chunksize); // set 0xffff...

    if (!num_keys) {
        return;
    }

    void* cur_entry = get_next_entry(NULL, aux);
    trie->root_bid = _hbtrie_load_recursive( trie,
                                             0,
                                             0,
                                             num_keys,
                                             get_next_entry,
                                             get_kv_from_entry,
                                             do_btreeblk_end,
                                             cur_entry,
                                             aux );
}